

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool __thiscall
cmInstallCommand::HandleFilesMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  MessageType t;
  bool bVar2;
  PolicyStatus PVar3;
  const_reference pvVar4;
  ostream *poVar5;
  reference pvVar6;
  string *psVar7;
  ulong uVar8;
  size_type sVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  size_type sVar10;
  cmGlobalGenerator *pcVar11;
  reference filename;
  cmInstallFilesGenerator *g;
  PolicyID id;
  char *pcVar12;
  string local_1080;
  undefined1 local_1060 [8];
  ostringstream e_5;
  undefined1 local_ee8 [8];
  string destination;
  undefined1 local_ea8 [8];
  ostringstream e_4;
  string local_d30;
  string local_d10;
  MessageType local_cec;
  undefined1 local_ce8 [4];
  MessageType messageType;
  ostringstream e_3;
  char *local_b70;
  char *modal;
  string *file;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmGlobalGenerator *gg;
  undefined1 local_b38 [4];
  PolicyStatus status;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  absFiles;
  undefined1 local_b00 [8];
  ostringstream e_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filesVector;
  undefined1 local_960 [8];
  ostringstream e_1;
  undefined1 local_7e8 [8];
  string type;
  string local_7c0;
  undefined1 local_7a0 [8];
  ostringstream e;
  undefined1 local_628 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  cmCAStringVector files;
  string local_588;
  undefined1 local_568 [8];
  cmInstallCommandArguments ica;
  bool programs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmInstallCommand *this_local;
  
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,0);
  ica.DefaultComponentName.field_2._M_local_buf[0xf] = std::operator==(pvVar4,"PROGRAMS");
  std::__cxx11::string::string((string *)&local_588,(string *)&this->DefaultComponentName);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_568,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  pcVar12 = "FILES";
  if ((ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar12 = "PROGRAMS";
  }
  cmCAStringVector::cmCAStringVector
            ((cmCAStringVector *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (cmCommandArgumentsHelper *)local_568,pcVar12,(cmCommandArgumentGroup *)0x0);
  cmCommandArgument::Follows
            ((cmCommandArgument *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows
            ((cmCommandArgumentGroup *)
             &ica.Parser.Arguments.
              super__Vector_base<cmCommandArgument_*,_std::allocator<cmCommandArgument_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (cmCommandArgument *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_628);
  cmInstallCommandArguments::Parse
            ((cmInstallCommandArguments *)local_568,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_628);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_628);
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_7a0);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar5 = std::operator<<((ostream *)local_7a0,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given unknown argument \"");
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_628,0);
    poVar5 = std::operator<<(poVar5,(string *)pvVar6);
    std::operator<<(poVar5,"\".");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    this_local._7_1_ = 0;
    type.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_7a0);
    goto LAB_0036a37b;
  }
  psVar7 = cmInstallCommandArguments::GetType_abi_cxx11_((cmInstallCommandArguments *)local_568);
  std::__cxx11::string::string((string *)local_7e8,(string *)psVar7);
  uVar8 = std::__cxx11::string::empty();
  if (((uVar8 & 1) == 0) &&
     (sVar9 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&allowedTypes_abi_cxx11_,(key_type *)local_7e8), sVar9 == 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_960);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    poVar5 = std::operator<<((ostream *)local_960,(string *)pvVar4);
    poVar5 = std::operator<<(poVar5," given non-type \"");
    poVar5 = std::operator<<(poVar5,(string *)local_7e8);
    std::operator<<(poVar5,"\" with TYPE argument.");
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(&this->super_cmCommand,(string *)&filesVector);
    std::__cxx11::string::~string((string *)&filesVector);
    this_local._7_1_ = 0;
    type.field_2._12_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_960);
  }
  else {
    this_00 = cmCAStringVector::GetVector_abi_cxx11_
                        ((cmCAStringVector *)
                         &unknownArgs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(this_00);
    if (bVar2) {
      this_local._7_1_ = 1;
      type.field_2._12_4_ = 1;
    }
    else {
      cmInstallCommandArguments::GetRename_abi_cxx11_((cmInstallCommandArguments *)local_568);
      uVar8 = std::__cxx11::string::empty();
      if (((uVar8 & 1) == 0) &&
         (sVar10 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(this_00), 1 < sVar10)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_b00);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        poVar5 = std::operator<<((ostream *)local_b00,(string *)pvVar4);
        std::operator<<(poVar5," given RENAME option with more than one file.");
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(&this->super_cmCommand,
                            (string *)
                            &absFiles.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &absFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_local._7_1_ = 0;
        type.field_2._12_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_b00);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_b38);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](args,0);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        bVar2 = MakeFilesFullPath(this,pcVar12,this_00,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)local_b38);
        if (bVar2) {
          PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0062,false);
          pcVar11 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
          __end1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(this_00);
          file = (string *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(this_00);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&file), bVar2) {
            filename = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&__end1);
            bVar2 = cmGlobalGenerator::IsExportedTargetsFile(pcVar11,filename);
            if (bVar2) {
              local_b70 = (char *)0x0;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ce8);
              local_cec = AUTHOR_WARNING;
              if (PVar3 != OLD) {
                if (PVar3 == WARN) {
                  cmPolicies::GetPolicyWarning_abi_cxx11_(&local_d10,(cmPolicies *)0x3e,id);
                  poVar5 = std::operator<<((ostream *)local_ce8,(string *)&local_d10);
                  std::operator<<(poVar5,"\n");
                  std::__cxx11::string::~string((string *)&local_d10);
                  local_b70 = "should";
                }
                else if (PVar3 - NEW < 3) {
                  local_b70 = "may";
                  local_cec = FATAL_ERROR;
                }
              }
              if (local_b70 == (char *)0x0) {
LAB_00369fba:
                type.field_2._12_4_ = 0;
              }
              else {
                poVar5 = std::operator<<((ostream *)local_ce8,"The file\n  ");
                poVar5 = std::operator<<(poVar5,(string *)filename);
                poVar5 = std::operator<<(poVar5,"\nwas generated by the export() command.  It ");
                poVar5 = std::operator<<(poVar5,local_b70);
                std::operator<<(poVar5,
                                " not be installed with the install() command.  Use the install(EXPORT) mechanism instead.  See the cmake-packages(7) manual for more.\n"
                               );
                t = local_cec;
                pcVar1 = (this->super_cmCommand).Makefile;
                std::__cxx11::ostringstream::str();
                cmMakefile::IssueMessage(pcVar1,t,&local_d30);
                std::__cxx11::string::~string((string *)&local_d30);
                if (local_cec != FATAL_ERROR) goto LAB_00369fba;
                this_local._7_1_ = 0;
                type.field_2._12_4_ = 1;
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ce8);
              if (type.field_2._12_4_ != 0) goto LAB_0036a343;
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end1);
          }
          bVar2 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_568);
          if (bVar2) {
            uVar8 = std::__cxx11::string::empty();
            if ((uVar8 & 1) == 0) {
              cmInstallCommandArguments::GetDestination_abi_cxx11_
                        ((cmInstallCommandArguments *)local_568);
              uVar8 = std::__cxx11::string::empty();
              if ((uVar8 & 1) == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ea8);
                pvVar4 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](args,0);
                poVar5 = std::operator<<((ostream *)local_ea8,(string *)pvVar4);
                std::operator<<(poVar5,
                                " given both TYPE and DESTINATION arguments. You may only specify one."
                               );
                std::__cxx11::ostringstream::str();
                cmCommand::SetError(&this->super_cmCommand,
                                    (string *)((long)&destination.field_2 + 8));
                std::__cxx11::string::~string((string *)(destination.field_2._M_local_buf + 8));
                this_local._7_1_ = 0;
                type.field_2._12_4_ = 1;
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ea8);
                goto LAB_0036a343;
              }
            }
            GetDestinationForType
                      ((string *)local_ee8,this,(cmInstallCommandArguments *)local_568,
                       (string *)local_7e8);
            uVar8 = std::__cxx11::string::empty();
            bVar2 = (uVar8 & 1) != 0;
            if (bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1060);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,0);
              poVar5 = std::operator<<((ostream *)local_1060,(string *)pvVar4);
              std::operator<<(poVar5," given no DESTINATION!");
              std::__cxx11::ostringstream::str();
              cmCommand::SetError(&this->super_cmCommand,&local_1080);
              std::__cxx11::string::~string((string *)&local_1080);
              type.field_2._12_4_ = 1;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1060);
            }
            else {
              pcVar1 = (this->super_cmCommand).Makefile;
              g = CreateInstallFilesGenerator
                            (pcVar1,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_b38,(cmInstallCommandArguments *)local_568,
                             (bool)(ica.DefaultComponentName.field_2._M_local_buf[0xf] & 1),
                             (string *)local_ee8);
              cmMakefile::AddInstallGenerator(pcVar1,&g->super_cmInstallGenerator);
              pcVar11 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
              psVar7 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                                 ((cmInstallCommandArguments *)local_568);
              cmGlobalGenerator::AddInstallComponent(pcVar11,psVar7);
              type.field_2._12_4_ = 1;
            }
            this_local._7_1_ = !bVar2;
            std::__cxx11::string::~string((string *)local_ee8);
          }
          else {
            this_local._7_1_ = 0;
            type.field_2._12_4_ = 1;
          }
        }
        else {
          this_local._7_1_ = 0;
          type.field_2._12_4_ = 1;
        }
LAB_0036a343:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b38);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_7e8);
LAB_0036a37b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_628);
  cmCAStringVector::~cmCAStringVector
            ((cmCAStringVector *)
             &unknownArgs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_568);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmInstallCommand::HandleFilesMode(std::vector<std::string> const& args)
{
  // This is the FILES mode.
  bool programs = (args[0] == "PROGRAMS");
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAStringVector files(&ica.Parser, programs ? "PROGRAMS" : "FILES");
  files.Follows(nullptr);
  ica.ArgumentGroup.Follows(&files);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
  }

  std::string type = ica.GetType();
  if (!type.empty() && allowedTypes.count(type) == 0) {
    std::ostringstream e;
    e << args[0] << " given non-type \"" << type << "\" with TYPE argument.";
    this->SetError(e.str());
    return false;
  }

  const std::vector<std::string>& filesVector = files.GetVector();

  // Check if there is something to do.
  if (filesVector.empty()) {
    return true;
  }

  if (!ica.GetRename().empty() && filesVector.size() > 1) {
    // The rename option works only with one file.
    std::ostringstream e;
    e << args[0] << " given RENAME option with more than one file.";
    this->SetError(e.str());
    return false;
  }

  std::vector<std::string> absFiles;
  if (!this->MakeFilesFullPath(args[0].c_str(), filesVector, absFiles)) {
    return false;
  }

  cmPolicies::PolicyStatus status =
    this->Makefile->GetPolicyStatus(cmPolicies::CMP0062);

  cmGlobalGenerator* gg = this->Makefile->GetGlobalGenerator();
  for (std::string const& file : filesVector) {
    if (gg->IsExportedTargetsFile(file)) {
      const char* modal = nullptr;
      std::ostringstream e;
      MessageType messageType = MessageType::AUTHOR_WARNING;

      switch (status) {
        case cmPolicies::WARN:
          e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0062) << "\n";
          modal = "should";
        case cmPolicies::OLD:
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
        case cmPolicies::NEW:
          modal = "may";
          messageType = MessageType::FATAL_ERROR;
      }
      if (modal) {
        e << "The file\n  " << file
          << "\nwas generated by the export() "
             "command.  It "
          << modal
          << " not be installed with the "
             "install() command.  Use the install(EXPORT) mechanism "
             "instead.  See the cmake-packages(7) manual for more.\n";
        this->Makefile->IssueMessage(messageType, e.str());
        if (messageType == MessageType::FATAL_ERROR) {
          return false;
        }
      }
    }
  }

  if (!ica.Finalize()) {
    return false;
  }

  if (!type.empty() && !ica.GetDestination().empty()) {
    std::ostringstream e;
    e << args[0]
      << " given both TYPE and DESTINATION arguments. You may only specify "
         "one.";
    this->SetError(e.str());
    return false;
  }

  std::string destination = this->GetDestinationForType(&ica, type);
  if (destination.empty()) {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
  }

  // Create the files install generator.
  this->Makefile->AddInstallGenerator(CreateInstallFilesGenerator(
    this->Makefile, absFiles, ica, programs, destination));

  // Tell the global generator about any installation component names
  // specified.
  this->Makefile->GetGlobalGenerator()->AddInstallComponent(
    ica.GetComponent());

  return true;
}